

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii.h
# Opt level: O2

string * absl::lts_20240722::AsciiStrToLower_abi_cxx11_(string_view s)

{
  string *in_RDI;
  allocator<char> local_21;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)in_RDI,&local_20,&local_21);
  absl::lts_20240722::AsciiStrToLower((string *)in_RDI);
  return in_RDI;
}

Assistant:

ABSL_MUST_USE_RESULT inline std::string AsciiStrToLower(absl::string_view s) {
  std::string result(s);
  absl::AsciiStrToLower(&result);
  return result;
}